

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O0

string * __thiscall pbrt::TexInfo::ToString_abi_cxx11_(TexInfo *this)

{
  string *in_RDI;
  WrapMode *in_stack_00000008;
  float *in_stack_00000010;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000020;
  char *in_stack_00000028;
  ColorEncodingHandle *in_stack_00000040;
  
  StringPrintf<std::__cxx11::string_const&,std::__cxx11::string_const&,float_const&,pbrt::WrapMode_const&,pbrt::ColorEncodingHandle_const&>
            (in_stack_00000028,in_stack_00000020,&this->filename,in_stack_00000010,in_stack_00000008
             ,in_stack_00000040);
  return in_RDI;
}

Assistant:

std::string TexInfo::ToString() const {
    return StringPrintf("[ TexInfo filename: %s filter: %s maxAniso: %f "
                        "wrapMode: %s encoding: %s ]",
                        filename, filter, maxAniso, wrapMode, encoding);
}